

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O2

BlockInfo * __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::GetBlockInfo
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this)

{
  BlockInfo *pBVar1;
  
  pBVar1 = HeapInfo::GetBlockInfo<MediumAllocationBlockAttributes>((uint)this->objectSize);
  return pBVar1;
}

Assistant:

typename SmallHeapBlockT<TBlockAttributes>::BlockInfo const*
SmallHeapBlockT<TBlockAttributes>::GetBlockInfo()
{
    return HeapInfo::GetBlockInfo<TBlockAttributes>(objectSize);
}